

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *prototype)

{
  int iVar1;
  Rep *pRVar2;
  ArenaImpl *this_00;
  Type *pTVar3;
  
  pRVar2 = this->rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = this->current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      this->current_size_ = iVar1 + 1;
      return (Type *)pRVar2->elements[iVar1];
    }
    if ((pRVar2 != (Rep *)0x0) && (pRVar2->allocated_size != this->total_size_)) goto LAB_001a2ccf;
  }
  if (this->current_size_ <= this->total_size_) {
    InternalExtend(this,(this->total_size_ - this->current_size_) + 1);
  }
LAB_001a2ccf:
  this->rep_->allocated_size = this->rep_->allocated_size + 1;
  this_00 = (ArenaImpl *)this->arena_;
  if (this_00 == (ArenaImpl *)0x0) {
    pTVar3 = (Type *)operator_new(0x20);
  }
  else {
    if ((this_00->lifecycle_id_ & 1) != 0) {
      Add<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)this_00);
    }
    pTVar3 = (Type *)ArenaImpl::AllocateAlignedAndAddCleanup
                               (this_00,0x20,arena_destruct_object<std::__cxx11::string>);
  }
  (pTVar3->_M_dataplus)._M_p = (pointer)&pTVar3->field_2;
  pTVar3->_M_string_length = 0;
  (pTVar3->field_2)._M_local_buf[0] = '\0';
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  this->rep_->elements[iVar1] = pTVar3;
  return pTVar3;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Add(
    typename TypeHandler::Type* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return cast<TypeHandler>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  typename TypeHandler::Type* result =
      TypeHandler::NewFromPrototype(prototype, arena_);
  rep_->elements[current_size_++] = result;
  return result;
}